

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O2

uint32_t __thiscall
dg::llvmdg::LLVMSlicer::slice
          (LLVMSlicer *this,LLVMDependenceGraph *dg,LLVMNode *start,uint32_t sl_id)

{
  long lVar1;
  long lVar2;
  Value *this_00;
  pointer ppFVar3;
  bool bVar4;
  char cVar5;
  iterator iVar6;
  long *plVar7;
  pointer ppFVar8;
  char *pcVar9;
  StringRef SVar10;
  vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> to_erase;
  uint32_t local_5c;
  StringRef local_58;
  _Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_> local_48;
  
  local_5c = sl_id;
  if (start != (LLVMNode *)0x0) {
    local_5c = Slicer<dg::LLVMNode>::mark(&this->super_Slicer<dg::LLVMNode>,start,sl_id,false);
  }
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar1 = *(long *)(dg + 0x140);
  plVar7 = (long *)(lVar1 + 0x20);
  while (ppFVar3 = local_48._M_impl.super__Vector_impl_data._M_finish, lVar2 = *plVar7,
        ppFVar8 = local_48._M_impl.super__Vector_impl_data._M_start, lVar2 != lVar1 + 0x18) {
    pcVar9 = (char *)(lVar2 + -0x38);
    if (lVar2 == 0) {
      pcVar9 = (char *)0x0;
    }
    SVar10 = (StringRef)llvm::Value::getName();
    local_58 = SVar10;
    bVar4 = dontTouch(this,&local_58);
    if (!bVar4) {
      local_58.Data = pcVar9;
      iVar6 = std::
              _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::LLVMDependenceGraph_*>,_std::_Select1st<std::pair<const_llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
              ::find((_Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::LLVMDependenceGraph_*>,_std::_Select1st<std::pair<const_llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
                      *)&constructedFunctions,(key_type *)&local_58);
      if (iVar6._M_node == (_Base_ptr)&llvm::cl::Option::vtable) {
        cVar5 = llvm::GlobalValue::isDeclaration();
        if (cVar5 == '\0') {
          local_58.Data = pcVar9;
          std::vector<llvm::Function*,std::allocator<llvm::Function*>>::
          emplace_back<llvm::Function*>
                    ((vector<llvm::Function*,std::allocator<llvm::Function*>> *)&local_48,
                     (Function **)&local_58);
        }
      }
      else {
        sliceGraph(this,(LLVMDependenceGraph *)iVar6._M_node[1]._M_parent,local_5c);
      }
    }
    plVar7 = (long *)(lVar2 + 8);
  }
  for (; ppFVar8 != ppFVar3; ppFVar8 = ppFVar8 + 1) {
    this_00 = (Value *)*ppFVar8;
    llvm::UndefValue::get(*(Type **)this_00);
    llvm::Value::replaceAllUsesWith(this_00);
    llvm::Function::deleteBody((Function *)this_00);
    llvm::Function::eraseFromParent();
  }
  std::_Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>::~_Vector_base(&local_48);
  return local_5c;
}

Assistant:

uint32_t slice(LLVMDependenceGraph *dg, LLVMNode *start,
                   uint32_t sl_id = 0) {
        // mark nodes for slicing
        assert(start || sl_id != 0);
        if (start)
            sl_id = mark(start, sl_id);

        std::vector<llvm::Function *> to_erase;
        for (auto &F : *dg->getModule()) {
            if (dontTouch(F.getName()))
                continue;

            auto it = constructedFunctions.find(&F);
            if (it == constructedFunctions.end()) {
                // remove (defined) functions that we didn't even constructed,
                // those are irrelevant in the slice
                if (!F.isDeclaration()) {
                    to_erase.push_back(&F);
                }
            } else {
                LLVMDependenceGraph *subdg = it->second;
                sliceGraph(subdg, sl_id);
            }
        }
        for (auto *F : to_erase) {
            F->replaceAllUsesWith(llvm::UndefValue::get(F->getType()));
            F->deleteBody();
            F->eraseFromParent();
        }

        return sl_id;
    }